

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_get_v3d(exr_const_context_t_conflict ctxt,int part_index,char *name,exr_attr_v3d_t *out)

{
  exr_attr_m33d_t *peVar1;
  double dVar2;
  exr_result_t eVar3;
  exr_attribute_t *in_RAX;
  exr_context_t nonc;
  exr_attribute_t *attr;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  attr = in_RAX;
  if (ctxt->mode == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
  }
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar3 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar3;
  }
  if ((name == (char *)0x0) || (*name == '\0')) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar3 = (*ctxt->report_error)(ctxt,3,"Invalid name for v3d attribute query");
    return eVar3;
  }
  eVar3 = exr_attr_list_find_by_name(ctxt,&ctxt->parts[(uint)part_index]->attributes,name,&attr);
  if (eVar3 == 0) {
    if (attr->type != EXR_ATTR_V3D) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar3 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'v3d\', but stored attributes is type \'%s\'",name,
                         attr->type_name);
      return eVar3;
    }
    if (out == (exr_attr_v3d_t *)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar3 = (*ctxt->print_error)(ctxt,3,"NULL output for \'%s\'",name);
      return eVar3;
    }
    peVar1 = (attr->field_6).m33d;
    out->z = peVar1->m[2];
    dVar2 = peVar1->m[1];
    out->x = peVar1->m[0];
    out->y = dVar2;
    eVar3 = 0;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_get_v3d (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    exr_attr_v3d_t*     out)
{
    ATTR_GET_IMPL_DEREF (EXR_ATTR_V3D, v3d);
}